

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_UUID __thiscall ONX_Model::CurrentDimensionStyleId(ONX_Model *this)

{
  ON_UUID OVar1;
  bool bVar2;
  ON_DimStyle *this_00;
  ON_UUID *b;
  ON_UUID component_model_id;
  undefined1 local_50 [8];
  ON_ModelComponentReference cr;
  undefined1 local_30 [8];
  ON_UUID id;
  ONX_Model *this_local;
  uchar local_10 [8];
  
  id.Data4 = (uchar  [8])this;
  _local_30 = ON_3dmSettings::CurrentDimensionStyleId(&this->m_settings);
  bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_30);
  if (bVar2) {
    this_local = (ONX_Model *)local_30;
    local_10 = (uchar  [8])id._0_8_;
  }
  else {
    cr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30;
    this_00 = ON_DimStyle::SystemDimstyleFromId(_local_30);
    b = ON_ModelComponent::Id(&this_00->super_ON_ModelComponent);
    bVar2 = ::operator==((ON_UUID_struct *)local_30,b);
    OVar1 = _local_30;
    if (bVar2) {
      this_local = (ONX_Model *)local_30;
      local_10 = (uchar  [8])id._0_8_;
    }
    else {
      component_model_id.Data4[0] = local_30[0];
      component_model_id.Data4[1] = local_30[1];
      component_model_id.Data4[2] = local_30[2];
      component_model_id.Data4[3] = local_30[3];
      component_model_id.Data4[4] = local_30[4];
      component_model_id.Data4[5] = local_30[5];
      component_model_id.Data4[6] = local_30[6];
      component_model_id.Data4[7] = local_30[7];
      component_model_id.Data1 = 8;
      component_model_id.Data2 = 0;
      component_model_id.Data3 = 0;
      _local_30 = OVar1;
      ComponentFromId((ONX_Model *)local_50,(Type)this,component_model_id);
      bVar2 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_50);
      if (bVar2) {
        this_local = (ONX_Model *)0;
        local_10[0] = '\0';
        local_10[1] = '\0';
        local_10[2] = '\0';
        local_10[3] = '\0';
        local_10[4] = '\0';
        local_10[5] = '\0';
        local_10[6] = '\0';
        local_10[7] = '\0';
      }
      else {
        this_local = (ONX_Model *)local_30;
        local_10 = (uchar  [8])id._0_8_;
      }
      ON_ModelComponentReference::~ON_ModelComponentReference
                ((ON_ModelComponentReference *)local_50);
    }
  }
  OVar1.Data4[0] = local_10[0];
  OVar1.Data4[1] = local_10[1];
  OVar1.Data4[2] = local_10[2];
  OVar1.Data4[3] = local_10[3];
  OVar1.Data4[4] = local_10[4];
  OVar1.Data4[5] = local_10[5];
  OVar1.Data4[6] = local_10[6];
  OVar1.Data4[7] = local_10[7];
  OVar1._0_8_ = this_local;
  return OVar1;
}

Assistant:

ON_UUID ONX_Model::CurrentDimensionStyleId() const
{
  const ON_UUID id = m_settings.CurrentDimensionStyleId();
  if (ON_nil_uuid == id)
    return id;
  if (id == ON_DimStyle::SystemDimstyleFromId(id).Id())
    return id;
  const ON_ModelComponentReference cr = ComponentFromId(ON_ModelComponent::Type::DimStyle,id);
  if (false == cr.IsEmpty())
    return id;
  return ON_nil_uuid;
}